

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::ConstructMessage<duckdb::SQLIdentifier,std::__cxx11::string>
          (string *__return_storage_ptr__,Exception *this,string *msg,SQLIdentifier *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  pointer *ppEVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> values;
  string local_88;
  SQLIdentifier local_68;
  vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> local_48;
  
  local_88._M_dataplus._M_p = (pointer)0x0;
  local_88._M_string_length = 0;
  local_88.field_2._M_allocated_capacity = 0;
  ppEVar1 = &local_48.
             super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pcVar3 = (msg->_M_dataplus)._M_p;
  local_48.
  super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)ppEVar1;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar3,pcVar3 + msg->_M_string_length);
  paVar2 = &local_68.raw_string.field_2;
  pcVar3 = (params->raw_string)._M_dataplus._M_p;
  local_68.raw_string._M_dataplus._M_p = (pointer)paVar2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar3,pcVar3 + (params->raw_string)._M_string_length);
  ConstructMessageRecursive<duckdb::SQLIdentifier,std::__cxx11::string>
            (__return_storage_ptr__,this,&local_88,&local_48,&local_68,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.raw_string._M_dataplus._M_p != paVar2) {
    operator_delete(local_68.raw_string._M_dataplus._M_p);
  }
  if (local_48.
      super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)ppEVar1) {
    operator_delete(local_48.
                    super__Vector_base<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  ~vector((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
          &local_88);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessage(const string &msg, ARGS... params) {
		const std::size_t num_args = sizeof...(ARGS);
		if (num_args == 0) {
			return msg;
		}
		std::vector<ExceptionFormatValue> values;
		return ConstructMessageRecursive(msg, values, params...);
	}